

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int ffi_callback_set(lua_State *L,GCfunc *fn)

{
  byte bVar1;
  CTState *cts;
  GCtab *t;
  uint64_t uVar2;
  MSize key;
  uint uVar3;
  GCcdata *pGVar4;
  TValue *pTVar5;
  uint64_t uVar6;
  GCobj *o;
  
  pGVar4 = ffi_checkcdata(L,(int)fn);
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  if (((((cts->tab[pGVar4->ctypeid].info & 0xf0000000) == 0x20000000) &&
       (cts->tab[pGVar4->ctypeid].size == 8)) &&
      (key = lj_ccallback_ptr2slot(cts,(void *)pGVar4[1].nextgc.gcptr64), key < (cts->cb).sizeid))
     && ((cts->cb).cbid[key] != 0)) {
    t = cts->miscmap;
    if (key < t->asize) {
      pTVar5 = (TValue *)((long)(int)key * 8 + (t->array).ptr64);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,key);
    }
    if (fn == (GCfunc *)0x0) {
      pTVar5->u64 = 0xffffffffffffffff;
      (cts->cb).cbid[key] = 0;
      uVar3 = (cts->cb).topid;
      if (key < uVar3) {
        uVar3 = key;
      }
      uVar6 = (uint64_t)uVar3;
      (cts->cb).topid = uVar3;
    }
    else {
      pTVar5->u64 = (ulong)fn | 0xfffb800000000000;
      bVar1 = t->marked;
      uVar6 = CONCAT71((int7)((ulong)pTVar5 >> 8),bVar1);
      if ((bVar1 & 4) != 0) {
        uVar2 = (L->glref).ptr64;
        t->marked = bVar1 & 0xfb;
        uVar6 = *(uint64_t *)(uVar2 + 0x40);
        (t->gclist).gcptr64 = uVar6;
        *(GCtab **)(uVar2 + 0x40) = t;
      }
    }
    return (int)uVar6;
  }
  lj_err_caller(L,LJ_ERR_FFI_BADCBACK);
}

Assistant:

static int ffi_callback_set(lua_State *L, GCfunc *fn)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  if (ctype_isptr(ct->info) && (LJ_32 || ct->size == 8)) {
    MSize slot = lj_ccallback_ptr2slot(cts, *(void **)cdataptr(cd));
    if (slot < cts->cb.sizeid && cts->cb.cbid[slot] != 0) {
      GCtab *t = cts->miscmap;
      TValue *tv = lj_tab_setint(L, t, (int32_t)slot);
      if (fn) {
	setfuncV(L, tv, fn);
	lj_gc_anybarriert(L, t);
      } else {
	setnilV(tv);
	cts->cb.cbid[slot] = 0;
	cts->cb.topid = slot < cts->cb.topid ? slot : cts->cb.topid;
      }
      return 0;
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_BADCBACK);
  return 0;
}